

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::batch_normalize
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  uint *puVar1;
  resizable_tensor *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  float *pfVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ostream *poVar8;
  fatal_error *pfVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  long i;
  long lVar16;
  long lVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  string local_230;
  double local_210;
  tensor *local_208;
  resizable_tensor *local_200;
  tensor *local_1f8;
  tensor *local_1f0;
  resizable_tensor *local_1e8;
  double local_1e0;
  ostringstream dlib_o_out;
  uint auStack_1c0 [88];
  string *local_60;
  float local_58;
  ostringstream *local_50;
  float local_48;
  ostringstream **local_40;
  string **local_38;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((averaging_factor < 0.0) || (1.0 < averaging_factor)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2d1);
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar8 = std::operator<<(poVar8,
                             "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar8,".\n\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar8 = std::operator<<(poVar8,"0 <= averaging_factor && averaging_factor <= 1");
    std::operator<<(poVar8,".\n");
    puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    std::operator<<((ostream *)&dlib_o_out,"averaging_factor: ");
    poVar8 = std::ostream::_M_insert<double>(averaging_factor);
    std::operator<<(poVar8,"\n");
    pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_230);
    __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
  }
  if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
    bVar2 = have_same_dimensions(&running_means->super_tensor,&means->super_tensor);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2d2);
      std::operator<<(poVar8,".\n");
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                              );
      std::operator<<(poVar8,".\n");
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar8 = std::operator<<(poVar8,
                               "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                              );
      std::operator<<(poVar8,".\n\n");
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar8 = std::operator<<(poVar8,
                               "averaging_factor==1 || have_same_dimensions(running_means,means)");
      std::operator<<(poVar8,".\n");
      puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
      *puVar1 = *puVar1 | 1;
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar8,"\n");
      pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_230);
      __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
    }
    bVar2 = have_same_dimensions(&running_variances->super_tensor,&invstds->super_tensor);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2d3);
      std::operator<<(poVar8,".\n");
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                              );
      std::operator<<(poVar8,".\n");
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar8 = std::operator<<(poVar8,
                               "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                              );
      std::operator<<(poVar8,".\n\n");
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar8 = std::operator<<(poVar8,
                               "averaging_factor==1 || have_same_dimensions(running_variances,invstds)"
                              );
      std::operator<<(poVar8,".\n");
      puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
      *puVar1 = *puVar1 | 1;
      poVar8 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar8,"\n");
      pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_230);
      __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
    }
  }
  local_1e8 = running_means;
  if ((((((src->m_n < 2) || (gamma->m_n != 1)) || (beta->m_n != 1)) ||
       ((gamma->m_nr != beta->m_nr || (gamma->m_nr != src->m_nr)))) ||
      ((gamma->m_nc != beta->m_nc || ((gamma->m_nc != src->m_nc || (gamma->m_k != beta->m_k)))))) ||
     ((eps <= 0.0 || (gamma->m_k != src->m_k)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2e8);
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar8,".\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar8 = std::operator<<(poVar8,
                             "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                            );
    std::operator<<(poVar8,".\n\n");
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar8 = std::operator<<(poVar8,
                             "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == beta.nr() && beta.nr() == src.nr() && gamma.nc() == beta.nc() && beta.nc() == src.nc() && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
                            );
    std::operator<<(poVar8,".\n");
    puVar1 = (uint *)((long)auStack_1c0 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar8 = std::operator<<((ostream *)&dlib_o_out,"\ngamma.num_samples(): ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\ngamma.k():  ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\ngamma.nr(): ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\ngamma.nc(): ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nbeta.num_samples(): ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nbeta.k():   ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nbeta.nr():  ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nbeta.nc():  ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nsrc.k():   ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nsrc.nr():  ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,"\nsrc.nc():  ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::operator<<(poVar8,"\neps:  ");
    poVar8 = std::ostream::_M_insert<double>(eps);
    std::operator<<(poVar8,"\n");
    pfVar9 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar9,EBROKEN_ASSERT,&local_230);
    __cxa_throw(pfVar9,&fatal_error::typeinfo,error::~error);
  }
  local_1f8 = gamma;
  local_1f0 = beta;
  resizable_tensor::copy_size(dest,src);
  resizable_tensor::set_size(means,1,src->m_k,src->m_nr,src->m_nc);
  resizable_tensor::set_size(invstds,1,src->m_k,src->m_nr,src->m_nc);
  tensor::operator=(&means->super_tensor,0.0);
  tensor::operator=(&invstds->super_tensor,0.0);
  iVar3 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*(means->super_tensor)._vptr_tensor[3])(means);
  lVar6 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = (*src->_vptr_tensor[2])(src);
  pfVar7 = (float *)CONCAT44(extraout_var_01,iVar3);
  lVar16 = src->m_n;
  lVar10 = src->m_nr * src->m_k * src->m_nc;
  lVar11 = 0;
  lVar17 = 0;
  if (0 < lVar16) {
    lVar17 = lVar16;
  }
  lVar12 = 0;
  if (0 < lVar10) {
    lVar12 = lVar10;
  }
  for (; pfVar15 = pfVar7, lVar13 = lVar17, lVar11 != lVar12; lVar11 = lVar11 + 1) {
    while (bVar2 = lVar13 != 0, lVar13 = lVar13 + -1, bVar2) {
      fVar18 = *pfVar15;
      *(float *)(lVar6 + lVar11 * 4) = *(float *)(lVar6 + lVar11 * 4) + fVar18;
      *(float *)(lVar5 + lVar11 * 4) = fVar18 * fVar18 + *(float *)(lVar5 + lVar11 * 4);
      pfVar15 = pfVar15 + lVar10;
    }
    pfVar7 = pfVar7 + 1;
  }
  local_200 = dest;
  tensor::operator/=(&means->super_tensor,(float)lVar16);
  tensor::operator/=(&invstds->super_tensor,(float)src->m_n);
  (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  (*(means->super_tensor)._vptr_tensor[3])(means);
  resizable_tensor::copy_size(running_variances,&invstds->super_tensor);
  iVar3 = (*(running_variances->super_tensor)._vptr_tensor[3])(running_variances);
  dVar19 = (double)src->m_n / ((double)src->m_n + -1.0);
  local_210 = 1.0 - averaging_factor;
  local_1e0 = dVar19 * averaging_factor;
  for (lVar16 = 0; lVar12 != lVar16; lVar16 = lVar16 + 1) {
    fVar18 = *(float *)(lVar6 + lVar16 * 4);
    fVar18 = *(float *)(lVar5 + lVar16 * 4) - fVar18 * fVar18;
    if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
      dVar20 = (double)*(float *)(CONCAT44(extraout_var_02,iVar3) + lVar16 * 4) * local_210 +
               local_1e0 * (double)fVar18;
    }
    else {
      dVar20 = dVar19 * (double)fVar18;
    }
    *(float *)(CONCAT44(extraout_var_02,iVar3) + lVar16 * 4) = (float)dVar20;
    dVar20 = (double)fVar18 + eps;
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    *(float *)(lVar5 + lVar16 * 4) = (float)(1.0 / dVar20);
  }
  local_208 = src;
  iVar3 = (*src->_vptr_tensor[2])(src);
  lVar17 = CONCAT44(extraout_var_03,iVar3);
  iVar3 = (*(local_200->super_tensor)._vptr_tensor[3])();
  lVar10 = CONCAT44(extraout_var_04,iVar3);
  iVar3 = (*local_1f8->_vptr_tensor[2])();
  iVar4 = (*local_1f0->_vptr_tensor[2])();
  this = local_1e8;
  lVar11 = 0;
  lVar16 = local_208->m_n;
  if (local_208->m_n < 1) {
    lVar16 = lVar11;
  }
  for (; lVar11 != lVar16; lVar11 = lVar11 + 1) {
    lVar13 = 0;
    for (lVar14 = 0; lVar12 != lVar14; lVar14 = lVar14 + 1) {
      fVar18 = (*(float *)(lVar17 + lVar14 * 4) - *(float *)(lVar6 + lVar14 * 4)) *
               *(float *)(lVar5 + lVar14 * 4);
      *(float *)(lVar10 + lVar14 * 4) = fVar18;
      *(float *)(lVar10 + lVar14 * 4) =
           fVar18 * *(float *)(CONCAT44(extraout_var_05,iVar3) + lVar14 * 4) +
           *(float *)(CONCAT44(extraout_var_06,iVar4) + lVar14 * 4);
      lVar13 = lVar13 + -4;
    }
    lVar17 = lVar17 - lVar13;
    lVar10 = lVar10 - lVar13;
  }
  resizable_tensor::copy_size(local_1e8,&means->super_tensor);
  if ((averaging_factor == 1.0) && (!NAN(averaging_factor))) {
    resizable_tensor::operator=(this,means);
    return;
  }
  mat((matrix_op<dlib::op_pointer_to_mat<float>_> *)&dlib_o_out,&this->super_tensor);
  local_48 = (float)local_210;
  local_50 = &dlib_o_out;
  mat((matrix_op<dlib::op_pointer_to_mat<float>_> *)&local_230,&means->super_tensor);
  local_58 = (float)averaging_factor;
  local_38 = &local_60;
  local_60 = &local_230;
  local_40 = &local_50;
  resizable_tensor::operator=
            (this,(matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
                   *)&local_40);
  return;
}

Assistant:

void batch_normalize (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == beta.nr() && beta.nr() == src.nr() &&
                gamma.nc() == beta.nc() && beta.nc() == src.nc() &&
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k(), src.nr(), src.nc());
            invstds.set_size(1, src.k(), src.nr(), src.nc());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            auto p_src = src.host();
            const long num = src.k()*src.nr()*src.nc();
            // compute means, and sum of squares
            for (long i = 0; i < num; ++i)
            {
                for (long n = 0; n < src.num_samples(); ++n)
                {
                    float val = p_src[n*num+i];
                    p_means[i] += val;
                    p_invstds[i] += val*val;
                }
            }
            means /= src.num_samples();
            invstds /= src.num_samples();
            // copy data back to host
            invstds.host(); means.host();

            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples())/(src.num_samples()-1.0);
            for (long i = 0; i < num; ++i)
            {
                auto actual_var = p_invstds[i] - p_means[i]*p_means[i];
                if (averaging_factor == 1)
                    rvar[i] = scale*actual_var;
                else
                    rvar[i] = (1-averaging_factor)*rvar[i] + scale*averaging_factor*actual_var;

                p_invstds[i] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    *p_dest = (*p_src - p_means[i])*p_invstds[i];
                    *p_dest = (*p_dest)*p_gamma[i] + p_beta[i];
                    ++p_src;
                    ++p_dest;
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }